

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

int __thiscall
QAccessibleComboBox::indexOfChild(QAccessibleComboBox *this,QAccessibleInterface *child)

{
  bool bVar1;
  QComboBox *pQVar2;
  QAbstractItemView *pQVar3;
  QAbstractItemView *pQVar4;
  QLineEdit *pQVar5;
  QLineEdit *pQVar6;
  long *in_RSI;
  QComboBox *cBox;
  QComboBox *in_stack_ffffffffffffffd0;
  
  pQVar2 = comboBox((QAccessibleComboBox *)0x7d502c);
  if (pQVar2 != (QComboBox *)0x0) {
    pQVar3 = QComboBox::view(in_stack_ffffffffffffffd0);
    pQVar4 = (QAbstractItemView *)(**(code **)(*in_RSI + 0x18))();
    if (pQVar3 == pQVar4) {
      return 0;
    }
    bVar1 = QComboBox::isEditable(in_stack_ffffffffffffffd0);
    if (bVar1) {
      pQVar5 = QComboBox::lineEdit(in_stack_ffffffffffffffd0);
      pQVar6 = (QLineEdit *)(**(code **)(*in_RSI + 0x18))();
      if (pQVar5 == pQVar6) {
        return 1;
      }
    }
  }
  return -1;
}

Assistant:

int QAccessibleComboBox::indexOfChild(const QAccessibleInterface *child) const
{
    if (QComboBox *cBox = comboBox()) {
        if (cBox->view() == child->object())
            return 0;
        if (cBox->isEditable() && cBox->lineEdit() == child->object())
            return 1;
    }
    return -1;
}